

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O1

bool testing::internal::
     TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,_testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,_bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,_testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  size_type sVar3;
  long lVar4;
  _Alloc_hider _Var5;
  undefined8 uVar6;
  undefined4 uVar7;
  _Alloc_hider type_param;
  bool bVar8;
  undefined1 uVar9;
  undefined1 extraout_AL;
  int iVar10;
  char *pcVar11;
  const_iterator cVar12;
  CodeLocation *pCVar13;
  long *plVar14;
  size_t sVar15;
  TestFactoryBase *pTVar16;
  _Alloc_hider _Var17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined8 extraout_RAX_00;
  ulong *puVar18;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  ulong uVar19;
  char *pcVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  char *pcVar22;
  CodeLocation *pCVar23;
  type_info *ptVar24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  undefined1 *puVar26;
  string test_name;
  string test_name_1;
  string test_name_2;
  string test_name_3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3a0;
  size_type local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_390;
  int local_380;
  string local_378;
  GTestLog local_354;
  string local_350;
  int local_330;
  string local_328;
  CodeLocation local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  size_type local_2d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d0;
  uint local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2b8;
  long local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  int local_298;
  string local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_270;
  size_type local_268;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_260;
  uint local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  size_type local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238;
  allocator<char> local_228;
  allocator<char> local_227;
  allocator<char> local_226;
  allocator<char> local_225;
  allocator<char> local_224;
  allocator<char> local_223;
  allocator<char> local_222;
  allocator<char> local_221;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  long local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  int local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1f8;
  size_type local_1f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e8;
  CodeLocation *local_1d8;
  TypedTestSuitePState *local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1c8;
  long local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  int local_1a8;
  string local_1a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  size_type local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_170;
  uint local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_158;
  size_type local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  key_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_118;
  size_type local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  CodeLocation *local_f8;
  size_type local_f0;
  undefined1 local_e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  key_type local_b0;
  undefined1 local_90 [17];
  undefined7 uStack_7f;
  undefined8 uStack_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  string local_50;
  
  local_1d0 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
  pcVar11 = strchr((char *)code_location,0x2c);
  if (pcVar11 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,(char *)code_location,&local_228);
  }
  else {
    local_158 = &local_148;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,code_location,pcVar11);
  }
  local_138._M_dataplus._M_p = (pointer)local_158;
  if (local_150 != 0) {
    pcVar11 = local_158->_M_local_buf + local_150;
    do {
      paVar21 = local_158;
      iVar10 = isspace((uint)(byte)pcVar11[-1]);
      local_138._M_dataplus._M_p = (pointer)paVar21;
      if (iVar10 == 0) break;
      pcVar20 = pcVar11 + -1;
      uVar19 = (long)pcVar20 - (long)paVar21;
      std::__cxx11::string::_M_erase((ulong)&local_158,uVar19);
      pcVar11 = local_158->_M_local_buf + uVar19;
      local_138._M_dataplus._M_p = (pointer)local_158;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar20 != paVar21);
  }
  local_158 = &local_148;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p == local_158) {
    local_138.field_2._8_8_ = local_148._8_8_;
    local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  }
  local_138.field_2._M_allocated_capacity._1_7_ = local_148._M_allocated_capacity._1_7_;
  local_138.field_2._M_local_buf[0] = local_148._M_local_buf[0];
  local_138._M_string_length = local_150;
  local_150 = 0;
  local_148._M_local_buf[0] = '\0';
  cVar12 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                   *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                  &local_138);
  iVar10 = 0x6f3868;
  if (cVar12._M_node ==
      (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10)) {
    FormatFileLocation_abi_cxx11_
              (&local_308.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x6f3868
              );
    TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
    ::Register();
LAB_002fcfa5:
    FormatFileLocation_abi_cxx11_
              (&local_308.file,(internal *)local_180->_M_local_buf,(char *)(ulong)local_160,iVar10);
    TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
    ::Register();
  }
  else {
    pCVar13 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                         &local_138);
    local_1c8 = &local_1b8;
    pcVar2 = (pCVar13->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,pcVar2,pcVar2 + (pCVar13->file)._M_string_length);
    local_1a8 = pCVar13->line;
    local_220 = &local_210;
    local_210._M_local_buf[0] = 'P';
    local_210._M_allocated_capacity._1_6_ = 0x697542687461;
    local_210._7_4_ = 0x7265646c;
    local_218 = 0xb;
    local_210._M_local_buf[0xb] = '\0';
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_220);
    local_2e0 = &local_2d0;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar21) {
      local_2d0._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2d0._8_8_ = plVar14[3];
    }
    else {
      local_2d0._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14;
    }
    local_2d8 = plVar14[1];
    *plVar14 = (long)paVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_2b8 = &local_2a8;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar21) {
      local_2a8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2a8._8_8_ = plVar14[3];
    }
    else {
      local_2a8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14;
    }
    local_2b0 = plVar14[1];
    *plVar14 = (long)paVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_3a0 = &local_390;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar21) {
      local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_390._8_8_ = plVar14[3];
    }
    else {
      local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14;
    }
    local_398 = plVar14[1];
    *plVar14 = (long)paVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    puVar18 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_350.field_2._M_allocated_capacity = *puVar18;
      local_350.field_2._8_8_ = plVar14[3];
    }
    else {
      local_350.field_2._M_allocated_capacity = *puVar18;
      local_350._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_350._M_string_length = plVar14[1];
    *plVar14 = (long)puVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    pcVar11 = strchr((char *)code_location,0x2c);
    if (pcVar11 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_378,(char *)code_location,&local_227);
    }
    else {
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,code_location,pcVar11);
    }
    _Var17._M_p = local_378._M_dataplus._M_p;
    if (local_378._M_string_length != 0) {
      pcVar11 = local_378._M_dataplus._M_p + local_378._M_string_length;
      do {
        _Var5._M_p = local_378._M_dataplus._M_p;
        iVar10 = isspace((uint)(byte)pcVar11[-1]);
        _Var17._M_p = _Var5._M_p;
        if (iVar10 == 0) break;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar11 + -1);
        uVar19 = (long)paVar21 - (long)_Var5._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_378,uVar19);
        pcVar11 = local_378._M_dataplus._M_p + uVar19;
        _Var17._M_p = local_378._M_dataplus._M_p;
      } while (paVar21 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var5._M_p);
    }
    uVar7 = local_260._7_4_;
    local_270 = &local_260;
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    local_260._M_local_buf[0] = (char)local_378.field_2._M_allocated_capacity;
    local_260._M_local_buf[7] = (char)((ulong)local_378.field_2._0_8_ >> 0x38);
    local_260._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_378.field_2._0_8_ >> 8);
    if (_Var17._M_p == local_378._M_dataplus._M_p) {
      local_260._8_3_ = (undefined3)local_378.field_2._8_8_;
      local_260._M_local_buf[0xb] = (char)((ulong)local_378.field_2._8_8_ >> 0x18);
      local_260._12_4_ = (undefined4)((ulong)local_378.field_2._8_8_ >> 0x20);
    }
    else {
      local_260._8_3_ = SUB43(uVar7,1);
      local_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var17._M_p;
    }
    paVar21 = local_270;
    local_268 = local_378._M_string_length;
    local_378._M_string_length = 0;
    local_378.field_2._M_allocated_capacity =
         local_378.field_2._M_allocated_capacity & 0xffffffffffffff00;
    GetTypeName_abi_cxx11_
              (&local_328,
               (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
               (type_info *)local_378._M_dataplus._M_p);
    _Var17._M_p = local_328._M_dataplus._M_p;
    local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
    local_1d8 = code_location;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_1c8,local_1c0 + (long)local_1c8);
    iVar10 = local_1a8;
    paVar25 = local_1c8;
    local_308.line = local_1a8;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_290,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar15 = strlen(paVar25->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar25->_M_local_buf,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar10);
      GTestLog::~GTestLog((GTestLog *)&local_290);
    }
    iVar10 = local_1a8;
    paVar25 = local_1c8;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_290,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar15 = strlen(paVar25->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar25->_M_local_buf,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar10);
      GTestLog::~GTestLog((GTestLog *)&local_290);
    }
    pTVar16 = (TestFactoryBase *)operator_new(8);
    pTVar16->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbce8;
    MakeAndRegisterTestInfo
              (&local_350,paVar21->_M_local_buf,_Var17._M_p,(char *)0x0,&local_308,
               &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
      operator_delete(local_308.file._M_dataplus._M_p,
                      local_308.file.field_2._M_allocated_capacity + 1);
    }
    pCVar13 = local_1d8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,
                      CONCAT17(local_328.field_2._M_local_buf[7],
                               CONCAT61(local_328.field_2._M_allocated_capacity._1_6_,
                                        local_328.field_2._M_local_buf[0])) + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,
                      CONCAT17(local_260._M_local_buf[7],
                               CONCAT61(local_260._M_allocated_capacity._1_6_,
                                        local_260._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,
                      CONCAT17(local_210._M_local_buf[7],
                               CONCAT61(local_210._M_allocated_capacity._1_6_,
                                        local_210._M_local_buf[0])) + 1);
    }
    if (local_1c8 == &local_1b8) {
      local_390._8_8_ = local_1b8._8_8_;
      local_3a0 = &local_390;
    }
    else {
      local_3a0 = local_1c8;
    }
    local_390._M_allocated_capacity._1_7_ = local_1b8._M_allocated_capacity._1_7_;
    local_390._M_local_buf[0] = local_1b8._M_local_buf[0];
    local_398 = local_1c0;
    local_1c0 = 0;
    local_1b8._M_local_buf[0] = '\0';
    local_380 = local_1a8;
    local_1c8 = &local_1b8;
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_1c8 != &local_1b8) {
      operator_delete(local_1c8,
                      CONCAT71(local_1b8._M_allocated_capacity._1_7_,local_1b8._M_local_buf[0]) + 1)
      ;
    }
    local_180 = &local_170;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(prefix + 0x10);
    if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)prefix == paVar21) {
      local_170._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_170._8_8_ = *(undefined8 *)(prefix + 0x18);
    }
    else {
      local_170._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_180 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)prefix;
    }
    local_178 = *(size_type *)(prefix + 8);
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)prefix = paVar21;
    prefix[8] = '\0';
    prefix[9] = '\0';
    prefix[10] = '\0';
    prefix[0xb] = '\0';
    prefix[0xc] = '\0';
    prefix[0xd] = '\0';
    prefix[0xe] = '\0';
    prefix[0xf] = '\0';
    prefix[0x10] = '\0';
    local_160 = *(uint *)(prefix + 0x20);
    pcVar11 = strchr((char *)pCVar13,0x2c);
    if (pcVar11 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar11 + 1);
        pcVar11 = pcVar11 + 1;
        iVar10 = isspace((uint)*pbVar1);
      } while (iVar10 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
    pcVar20 = strchr(pcVar11,0x2c);
    if (pcVar20 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,pcVar11,&local_226);
    }
    else {
      local_118 = &local_108;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,pcVar11,pcVar20);
    }
    local_b0._M_dataplus._M_p = (pointer)local_118;
    if (local_110 != 0) {
      pcVar20 = local_118->_M_local_buf + local_110;
      do {
        paVar21 = local_118;
        iVar10 = isspace((uint)(byte)pcVar20[-1]);
        local_b0._M_dataplus._M_p = (pointer)paVar21;
        if (iVar10 == 0) break;
        pcVar22 = pcVar20 + -1;
        uVar19 = (long)pcVar22 - (long)paVar21;
        std::__cxx11::string::_M_erase((ulong)&local_118,uVar19);
        pcVar20 = local_118->_M_local_buf + uVar19;
        local_b0._M_dataplus._M_p = (pointer)local_118;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar22 != paVar21);
    }
    local_118 = &local_108;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p == local_118) {
      local_b0.field_2._8_8_ = local_108._8_8_;
      local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    }
    local_b0.field_2._M_allocated_capacity._1_7_ = local_108._M_allocated_capacity._1_7_;
    local_b0.field_2._M_local_buf[0] = local_108._M_local_buf[0];
    local_b0._M_string_length = local_110;
    local_110 = 0;
    local_108._M_local_buf[0] = '\0';
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                     *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                    &local_b0);
    iVar10 = 0x6f3868;
    if (cVar12._M_node ==
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10))
    goto LAB_002fcfa5;
    pCVar13 = TypedTestSuitePState::GetCodeLocation
                        ((TypedTestSuitePState *)
                         bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                         &local_b0);
    local_220 = &local_210;
    pcVar2 = (pCVar13->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar2,pcVar2 + (pCVar13->file)._M_string_length);
    local_200 = pCVar13->line;
    local_270 = &local_260;
    local_260._M_local_buf[0] = 'P';
    local_260._M_allocated_capacity._1_6_ = 0x697542687461;
    local_260._7_4_ = 0x7265646c;
    local_268 = 0xb;
    local_260._M_local_buf[0xb] = '\0';
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2e0 = &local_2d0;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar21) {
      local_2d0._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2d0._8_8_ = plVar14[3];
    }
    else {
      local_2d0._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14;
    }
    local_2d8 = plVar14[1];
    *plVar14 = (long)paVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_2e0);
    local_2b8 = &local_2a8;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar21) {
      local_2a8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2a8._8_8_ = plVar14[3];
    }
    else {
      local_2a8._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_2b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14;
    }
    local_2b0 = plVar14[1];
    *plVar14 = (long)paVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_3a0 = &local_390;
    paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar21) {
      local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_390._8_8_ = plVar14[3];
    }
    else {
      local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
      local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)*plVar14;
    }
    local_398 = plVar14[1];
    *plVar14 = (long)paVar21;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    puVar18 = (ulong *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar18) {
      local_350.field_2._M_allocated_capacity = *puVar18;
      local_350.field_2._8_8_ = plVar14[3];
    }
    else {
      local_350.field_2._M_allocated_capacity = *puVar18;
      local_350._M_dataplus._M_p = (pointer)*plVar14;
    }
    local_350._M_string_length = plVar14[1];
    *plVar14 = (long)puVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    pcVar20 = strchr(pcVar11,0x2c);
    if (pcVar20 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,pcVar11,&local_225);
    }
    else {
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,pcVar11,pcVar20);
    }
    _Var17._M_p = local_328._M_dataplus._M_p;
    if (local_328._M_string_length != 0) {
      pcVar20 = local_328._M_dataplus._M_p + local_328._M_string_length;
      do {
        _Var5._M_p = local_328._M_dataplus._M_p;
        iVar10 = isspace((uint)(byte)pcVar20[-1]);
        _Var17._M_p = _Var5._M_p;
        if (iVar10 == 0) break;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(pcVar20 + -1);
        uVar19 = (long)paVar21 - (long)_Var5._M_p;
        std::__cxx11::string::_M_erase((ulong)&local_328,uVar19);
        pcVar20 = local_328._M_dataplus._M_p + uVar19;
        _Var17._M_p = local_328._M_dataplus._M_p;
      } while (paVar21 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var5._M_p);
    }
    local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
    local_378._M_dataplus._M_p = _Var17._M_p;
    if (_Var17._M_p == local_328._M_dataplus._M_p) {
      local_378.field_2._8_8_ =
           CONCAT44(local_328.field_2._12_4_,
                    CONCAT13(local_328.field_2._M_local_buf[0xb],local_328.field_2._8_3_));
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    }
    _Var17._M_p = local_378._M_dataplus._M_p;
    local_378.field_2._M_allocated_capacity._1_6_ = local_328.field_2._M_allocated_capacity._1_6_;
    local_378.field_2._M_local_buf[0] = local_328.field_2._M_local_buf[0];
    local_378.field_2._M_local_buf[7] = local_328.field_2._M_local_buf[7];
    local_378._M_string_length = local_328._M_string_length;
    local_328._M_string_length = 0;
    local_328.field_2._M_local_buf[0] = '\0';
    GetTypeName_abi_cxx11_
              (&local_290,
               (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
               (type_info *)local_328._M_dataplus._M_p);
    _Var5._M_p = local_290._M_dataplus._M_p;
    local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_308,local_220,local_218 + (long)local_220);
    iVar10 = local_200;
    paVar21 = local_220;
    local_308.line = local_200;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_248,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x201);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                 ,0x6a);
      if (paVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar15 = strlen(paVar21->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar10);
      GTestLog::~GTestLog((GTestLog *)&local_248);
    }
    iVar10 = local_200;
    paVar21 = local_220;
    bVar8 = IsTrue(true);
    if (!bVar8) {
      GTestLog::GTestLog((GTestLog *)&local_248,GTEST_FATAL,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                         ,0x216);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                 ,0x6f);
      if (paVar21 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
      }
      else {
        sVar15 = strlen(paVar21->_M_local_buf);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar15);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
      std::ostream::operator<<((ostream *)&std::cerr,iVar10);
      GTestLog::~GTestLog((GTestLog *)&local_248);
    }
    pTVar16 = (TestFactoryBase *)operator_new(8);
    pTVar16->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbdd8;
    MakeAndRegisterTestInfo
              (&local_350,_Var17._M_p,_Var5._M_p,(char *)0x0,&local_308,
               &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar16);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
      operator_delete(local_308.file._M_dataplus._M_p,
                      local_308.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_290._M_dataplus._M_p != &local_290.field_2) {
      operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != &local_378.field_2) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_328._M_dataplus._M_p != &local_328.field_2) {
      operator_delete(local_328._M_dataplus._M_p,
                      CONCAT17(local_328.field_2._M_local_buf[7],
                               CONCAT61(local_328.field_2._M_allocated_capacity._1_6_,
                                        local_328.field_2._M_local_buf[0])) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
    }
    if (local_2e0 != &local_2d0) {
      operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
    }
    if (local_270 != &local_260) {
      operator_delete(local_270,
                      CONCAT17(local_260._M_local_buf[7],
                               CONCAT61(local_260._M_allocated_capacity._1_6_,
                                        local_260._M_local_buf[0])) + 1);
    }
    if (local_220 == &local_210) {
      local_390._8_8_ =
           CONCAT44(local_210._12_4_,CONCAT13(local_210._M_local_buf[0xb],local_210._8_3_));
      local_3a0 = &local_390;
    }
    else {
      local_3a0 = local_220;
    }
    local_390._M_allocated_capacity._1_6_ = local_210._M_allocated_capacity._1_6_;
    local_390._M_local_buf[0] = local_210._M_local_buf[0];
    local_390._M_local_buf[7] = local_210._M_local_buf[7];
    local_398 = local_218;
    local_218 = 0;
    local_210._M_local_buf[0] = '\0';
    local_380 = local_200;
    local_220 = &local_210;
    if (local_3a0 != &local_390) {
      operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
    }
    if (local_220 != &local_210) {
      operator_delete(local_220,
                      CONCAT17(local_210._M_local_buf[7],
                               CONCAT61(local_210._M_allocated_capacity._1_6_,
                                        local_210._M_local_buf[0])) + 1);
    }
    uVar7 = local_260._7_4_;
    local_270 = &local_260;
    local_260._M_local_buf[0] = (char)local_170._M_allocated_capacity;
    local_260._M_local_buf[7] = (char)((ulong)local_170._0_8_ >> 0x38);
    local_260._M_allocated_capacity._1_6_ = (undefined6)((ulong)local_170._0_8_ >> 8);
    if (local_180 == &local_170) {
      local_260._8_3_ = (undefined3)local_170._8_8_;
      local_260._M_local_buf[0xb] = (char)((ulong)local_170._8_8_ >> 0x18);
      local_260._12_4_ = (undefined4)((ulong)local_170._8_8_ >> 0x20);
    }
    else {
      local_270 = local_180;
      local_260._8_3_ = SUB43(uVar7,1);
    }
    local_268 = local_178;
    local_178 = 0;
    local_170._M_allocated_capacity = local_170._M_allocated_capacity & 0xffffffffffffff00;
    local_250 = local_160;
    local_180 = &local_170;
    pcVar11 = strchr(pcVar11,0x2c);
    if (pcVar11 == (char *)0x0) {
      pcVar11 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar11 + 1);
        pcVar11 = pcVar11 + 1;
        iVar10 = isspace((uint)*pbVar1);
      } while (iVar10 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
    pcVar20 = strchr(pcVar11,0x2c);
    if (pcVar20 == (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_f8,pcVar11,&local_224);
    }
    else {
      local_f8 = (CodeLocation *)local_e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,pcVar11,pcVar20);
    }
    local_90._0_8_ = local_f8;
    if (local_f0 != 0) {
      puVar26 = (undefined1 *)((long)&(local_f8->file)._M_dataplus._M_p + local_f0);
      do {
        pCVar13 = local_f8;
        iVar10 = isspace((uint)(byte)puVar26[-1]);
        local_90._0_8_ = pCVar13;
        if (iVar10 == 0) break;
        pCVar23 = (CodeLocation *)(puVar26 + -1);
        uVar19 = (long)pCVar23 - (long)pCVar13;
        std::__cxx11::string::_M_erase((ulong)&local_f8,uVar19);
        puVar26 = (undefined1 *)(uVar19 + (long)local_f8);
        local_90._0_8_ = local_f8;
      } while (pCVar23 != pCVar13);
    }
    local_1d8 = (CodeLocation *)(local_90 + 0x10);
    local_f8 = (CodeLocation *)local_e8;
    if ((CodeLocation *)local_90._0_8_ == local_f8) {
      uStack_78 = local_e8._8_8_;
      local_90._0_8_ = local_1d8;
    }
    uStack_7f = local_e8._1_7_;
    local_90[0x10] = local_e8[0];
    local_90._8_8_ = local_f0;
    local_f0 = 0;
    local_e8[0] = 0;
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                     *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8),
                    (key_type *)local_90);
    iVar10 = 0x6f3868;
    if (cVar12._M_node !=
        (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10))
    {
      pCVar13 = TypedTestSuitePState::GetCodeLocation
                          ((TypedTestSuitePState *)
                           bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                           (string *)local_90);
      local_2b8 = &local_2a8;
      pcVar2 = (pCVar13->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,pcVar2,pcVar2 + (pCVar13->file)._M_string_length);
      local_298 = pCVar13->line;
      local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
      local_328.field_2._M_local_buf[0] = 'P';
      local_328.field_2._M_allocated_capacity._1_6_ = 0x697542687461;
      local_328.field_2._7_4_ = 0x7265646c;
      local_328._M_string_length = 0xb;
      local_328.field_2._M_local_buf[0xb] = '\0';
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_328);
      local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 == paVar21) {
        local_378.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_378.field_2._8_8_ = plVar14[3];
      }
      else {
        local_378.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_378._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_378._M_string_length = plVar14[1];
      *plVar14 = (long)paVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_378);
      local_2e0 = &local_2d0;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 == paVar21) {
        local_2d0._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_2d0._8_8_ = plVar14[3];
      }
      else {
        local_2d0._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_2e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14;
      }
      local_2d8 = plVar14[1];
      *plVar14 = (long)paVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::append((char *)&local_2e0);
      local_3a0 = &local_390;
      paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 == paVar21) {
        local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_390._8_8_ = plVar14[3];
      }
      else {
        local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
        local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar14;
      }
      local_398 = plVar14[1];
      *plVar14 = (long)paVar21;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
      local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
      puVar18 = (ulong *)(plVar14 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar14 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar18) {
        local_350.field_2._M_allocated_capacity = *puVar18;
        local_350.field_2._8_8_ = plVar14[3];
      }
      else {
        local_350.field_2._M_allocated_capacity = *puVar18;
        local_350._M_dataplus._M_p = (pointer)*plVar14;
      }
      local_350._M_string_length = plVar14[1];
      *plVar14 = (long)puVar18;
      plVar14[1] = 0;
      *(undefined1 *)(plVar14 + 2) = 0;
      pcVar20 = strchr(pcVar11,0x2c);
      if (pcVar20 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,pcVar11,&local_223);
      }
      else {
        local_248 = &local_238;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,pcVar11,pcVar20);
      }
      local_290._M_dataplus._M_p = (pointer)local_248;
      if (local_240 != 0) {
        ptVar24 = (type_info *)(local_248->_M_local_buf + local_240);
        do {
          paVar21 = local_248;
          iVar10 = isspace((uint)(byte)ptVar24[-1]);
          local_290._M_dataplus._M_p = (pointer)paVar21;
          if (iVar10 == 0) break;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ptVar24 + -1);
          uVar19 = (long)paVar25 - (long)paVar21;
          std::__cxx11::string::_M_erase((ulong)&local_248,uVar19);
          ptVar24 = (type_info *)(local_248->_M_local_buf + uVar19);
          local_290._M_dataplus._M_p = (pointer)local_248;
        } while (paVar25 != paVar21);
      }
      local_248 = &local_238;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p == local_248) {
        local_290.field_2._8_8_ =
             CONCAT44(local_238._12_4_,CONCAT13(local_238._M_local_buf[0xb],local_238._8_3_));
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
      }
      _Var17._M_p = local_290._M_dataplus._M_p;
      local_290.field_2._M_allocated_capacity._1_6_ = local_238._M_allocated_capacity._1_6_;
      local_290.field_2._M_local_buf[0] = local_238._M_local_buf[0];
      local_290.field_2._M_local_buf[7] = local_238._M_local_buf[7];
      local_290._M_string_length = local_240;
      local_240 = 0;
      local_238._M_local_buf[0] = '\0';
      GetTypeName_abi_cxx11_
                (&local_1a0,
                 (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
                 (type_info *)local_248->_M_local_buf);
      _Var5._M_p = local_1a0._M_dataplus._M_p;
      local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_308,local_2b8,local_2b0 + (long)local_2b8);
      iVar10 = local_298;
      paVar21 = local_2b8;
      local_308.line = local_298;
      bVar8 = IsTrue(true);
      if (!bVar8) {
        GTestLog::GTestLog((GTestLog *)&local_1f8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x201);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                   ,0x6a);
        if (paVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
        }
        else {
          sVar15 = strlen(paVar21->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar10);
        GTestLog::~GTestLog((GTestLog *)&local_1f8);
      }
      iVar10 = local_298;
      paVar21 = local_2b8;
      bVar8 = IsTrue(true);
      if (!bVar8) {
        GTestLog::GTestLog((GTestLog *)&local_1f8,GTEST_FATAL,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                           ,0x216);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                   ,0x6f);
        if (paVar21 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
        }
        else {
          sVar15 = strlen(paVar21->_M_local_buf);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,paVar21->_M_local_buf,sVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
        std::ostream::operator<<((ostream *)&std::cerr,iVar10);
        GTestLog::~GTestLog((GTestLog *)&local_1f8);
      }
      pTVar16 = (TestFactoryBase *)operator_new(8);
      pTVar16->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbea0;
      MakeAndRegisterTestInfo
                (&local_350,_Var17._M_p,_Var5._M_p,(char *)0x0,&local_308,
                 &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                  ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar16);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
        operator_delete(local_308.file._M_dataplus._M_p,
                        local_308.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
        operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_290._M_dataplus._M_p != &local_290.field_2) {
        operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
      }
      if (local_248 != &local_238) {
        operator_delete(local_248,
                        CONCAT17(local_238._M_local_buf[7],
                                 CONCAT61(local_238._M_allocated_capacity._1_6_,
                                          local_238._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_350._M_dataplus._M_p != &local_350.field_2) {
        operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
      }
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
      }
      if (local_2e0 != &local_2d0) {
        operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_328._M_dataplus._M_p != &local_328.field_2) {
        operator_delete(local_328._M_dataplus._M_p,
                        CONCAT17(local_328.field_2._M_local_buf[7],
                                 CONCAT61(local_328.field_2._M_allocated_capacity._1_6_,
                                          local_328.field_2._M_local_buf[0])) + 1);
      }
      uVar6 = local_2a8._M_allocated_capacity;
      if (local_2b8 == &local_2a8) {
        local_390._8_8_ = local_2a8._8_8_;
        local_3a0 = &local_390;
      }
      else {
        local_3a0 = local_2b8;
      }
      local_390._M_allocated_capacity = local_2a8._M_allocated_capacity;
      local_398 = local_2b0;
      local_2b0 = 0;
      local_2a8._M_allocated_capacity = local_2a8._M_allocated_capacity & 0xffffffffffffff00;
      local_380 = local_298;
      local_2b8 = &local_2a8;
      if (local_3a0 != &local_390) {
        operator_delete(local_3a0,uVar6 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8._M_allocated_capacity + 1);
      }
      local_2e0 = &local_2d0;
      if (local_270 == &local_260) {
        local_2d0._8_8_ =
             CONCAT44(local_260._12_4_,CONCAT13(local_260._M_local_buf[0xb],local_260._8_3_));
      }
      else {
        local_2e0 = local_270;
      }
      local_2d0._M_allocated_capacity._1_6_ = local_260._M_allocated_capacity._1_6_;
      local_2d0._M_local_buf[0] = local_260._M_local_buf[0];
      local_2d0._M_local_buf[7] = local_260._M_local_buf[7];
      local_2d8 = local_268;
      local_268 = 0;
      local_260._M_local_buf[0] = '\0';
      local_2c0 = local_250;
      local_270 = &local_260;
      pcVar11 = strchr(pcVar11,0x2c);
      if (pcVar11 == (char *)0x0) {
        pcVar11 = (char *)0x0;
      }
      else {
        do {
          pbVar1 = (byte *)(pcVar11 + 1);
          pcVar11 = pcVar11 + 1;
          iVar10 = isspace((uint)*pbVar1);
        } while (iVar10 != 0);
      }
      RegisterTypeParameterizedTestSuiteInstantiation("PkitsTest09RequireExplicitPolicy");
      pcVar20 = strchr(pcVar11,0x2c);
      if (pcVar20 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)(local_e8 + 0x10),pcVar11,&local_222);
      }
      else {
        local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x20);
        std::__cxx11::string::_M_construct<char_const*>((string *)(local_e8 + 0x10),pcVar11,pcVar20)
        ;
      }
      local_70._M_allocated_capacity = local_d8._M_allocated_capacity;
      if (local_d8._8_8_ != 0) {
        pcVar20 = (char *)(local_d8._8_8_ + local_d8._M_allocated_capacity);
        do {
          uVar6 = local_d8._M_allocated_capacity;
          iVar10 = isspace((uint)(byte)pcVar20[-1]);
          local_70._M_allocated_capacity = uVar6;
          if (iVar10 == 0) break;
          paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pcVar20 + -1);
          uVar19 = (long)paVar21 - uVar6;
          std::__cxx11::string::_M_erase((ulong)(local_e8 + 0x10),uVar19);
          pcVar20 = (char *)(uVar19 + local_d8._M_allocated_capacity);
          local_70._M_allocated_capacity = local_d8._M_allocated_capacity;
        } while (paVar21 !=
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)uVar6);
      }
      local_b8 = &local_60;
      local_d8._M_allocated_capacity = (size_type)(local_e8 + 0x20);
      if (local_70._M_allocated_capacity == local_d8._M_allocated_capacity) {
        local_60._8_8_ = local_c8._8_8_;
        local_70._M_allocated_capacity = (size_type)local_b8;
      }
      local_60._M_allocated_capacity._1_7_ = local_c8._M_allocated_capacity._1_7_;
      local_60._M_local_buf[0] = local_c8._M_local_buf[0];
      local_70._8_8_ = local_d8._8_8_;
      local_d8._8_8_ = 0;
      local_c8._M_local_buf[0] = 0;
      cVar12 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
               ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
                       *)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 8
                         ),(key_type *)&local_70);
      iVar10 = 0x6f3868;
      if (cVar12._M_node !=
          (_Base_ptr)(bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_ + 0x10)
         ) {
        pCVar13 = TypedTestSuitePState::GetCodeLocation
                            ((TypedTestSuitePState *)
                             bssl::gtest_typed_test_suite_p_state_PkitsTest09RequireExplicitPolicy_,
                             (string *)&local_70);
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        pcVar2 = (pCVar13->file)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_350,pcVar2,pcVar2 + (pCVar13->file)._M_string_length);
        local_330 = pCVar13->line;
        local_248 = &local_238;
        local_238._M_local_buf[0] = 'P';
        local_238._M_allocated_capacity._1_6_ = 0x697542687461;
        local_238._7_4_ = 0x7265646c;
        local_240 = 0xb;
        local_238._M_local_buf[0xb] = '\0';
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_248);
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar21) {
          local_290.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_290.field_2._8_8_ = plVar14[3];
        }
        else {
          local_290.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_290._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_290._M_string_length = plVar14[1];
        *plVar14 = (long)paVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_290);
        local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar21) {
          sVar3 = paVar21->_M_allocated_capacity;
          lVar4 = plVar14[3];
          local_328.field_2._M_local_buf[0] = (char)sVar3;
          local_328.field_2._M_allocated_capacity._1_6_ = (undefined6)(sVar3 >> 8);
          local_328.field_2._M_local_buf[7] = (char)(sVar3 >> 0x38);
          local_328.field_2._8_3_ = (undefined3)lVar4;
          local_328.field_2._M_local_buf[0xb] = (char)((ulong)lVar4 >> 0x18);
          local_328.field_2._12_4_ = (undefined4)((ulong)lVar4 >> 0x20);
        }
        else {
          sVar3 = paVar21->_M_allocated_capacity;
          local_328.field_2._M_local_buf[0] = (char)sVar3;
          local_328.field_2._M_allocated_capacity._1_6_ = (undefined6)(sVar3 >> 8);
          local_328.field_2._M_local_buf[7] = (char)(sVar3 >> 0x38);
          local_328._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_328._M_string_length = plVar14[1];
        *plVar14 = (long)paVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_328);
        local_3a0 = &local_390;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar21) {
          local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_390._8_8_ = plVar14[3];
        }
        else {
          local_390._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar14;
        }
        local_398 = plVar14[1];
        *plVar14 = (long)paVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::_M_append((char *)&local_3a0,**(ulong **)local_1d0);
        local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
        paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 == paVar21) {
          local_378.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_378.field_2._8_8_ = plVar14[3];
        }
        else {
          local_378.field_2._M_allocated_capacity = paVar21->_M_allocated_capacity;
          local_378._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_378._M_string_length = plVar14[1];
        *plVar14 = (long)paVar21;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        pcVar20 = strchr(pcVar11,0x2c);
        if (pcVar20 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1f8,pcVar11,&local_221);
          ptVar24 = extraout_RDX_00;
        }
        else {
          local_1f8 = &local_1e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar11,pcVar20);
          ptVar24 = extraout_RDX;
        }
        local_1a0._M_dataplus._M_p = (pointer)local_1f8;
        if (local_1f0 != 0) {
          pcVar11 = local_1f8->_M_local_buf + local_1f0;
          do {
            paVar21 = local_1f8;
            iVar10 = isspace((uint)(byte)pcVar11[-1]);
            local_1a0._M_dataplus._M_p = (pointer)paVar21;
            ptVar24 = extraout_RDX_01;
            if (iVar10 == 0) break;
            pcVar20 = pcVar11 + -1;
            uVar19 = (long)pcVar20 - (long)paVar21;
            std::__cxx11::string::_M_erase((ulong)&local_1f8,uVar19);
            pcVar11 = local_1f8->_M_local_buf + uVar19;
            local_1a0._M_dataplus._M_p = (pointer)local_1f8;
            ptVar24 = extraout_RDX_02;
          } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)pcVar20 != paVar21);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p == &local_1e8) {
          local_1a0.field_2._8_8_ = local_1e8._8_8_;
          local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
        }
        _Var5._M_p = local_1a0._M_dataplus._M_p;
        local_1a0.field_2._M_allocated_capacity._1_7_ = local_1e8._M_allocated_capacity._1_7_;
        local_1a0.field_2._M_local_buf[0] = local_1e8._M_local_buf[0];
        local_1a0._M_string_length = local_1f0;
        local_1f0 = 0;
        local_1e8._M_local_buf[0] = '\0';
        local_1f8 = &local_1e8;
        GetTypeName_abi_cxx11_
                  (&local_50,
                   (internal *)&bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate::typeinfo,
                   ptVar24);
        type_param._M_p = local_50._M_dataplus._M_p;
        local_308.file._M_dataplus._M_p = (pointer)&local_308.file.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_308,local_350._M_dataplus._M_p,
                   local_350._M_dataplus._M_p + local_350._M_string_length);
        iVar10 = local_330;
        _Var17._M_p = local_350._M_dataplus._M_p;
        local_308.line = local_330;
        bVar8 = IsTrue(true);
        if (!bVar8) {
          GTestLog::GTestLog(&local_354,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x201);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
                     ,0x6a);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var17._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
          }
          else {
            sVar15 = strlen(_Var17._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var17._M_p,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar10);
          GTestLog::~GTestLog(&local_354);
        }
        iVar10 = local_330;
        _Var17._M_p = local_350._M_dataplus._M_p;
        bVar8 = IsTrue(true);
        if (!bVar8) {
          GTestLog::GTestLog(&local_354,GTEST_FATAL,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/third_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                             ,0x216);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32
                    );
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
                     ,0x6f);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var17._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x6f7748);
          }
          else {
            sVar15 = strlen(_Var17._M_p);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,_Var17._M_p,sVar15);
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
          std::ostream::operator<<((ostream *)&std::cerr,iVar10);
          GTestLog::~GTestLog(&local_354);
        }
        pTVar16 = (TestFactoryBase *)operator_new(8);
        pTVar16->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_006cbf68;
        MakeAndRegisterTestInfo
                  (&local_378,_Var5._M_p,type_param._M_p,(char *)0x0,&local_308,
                   &TypeIdHelper<bssl::PkitsTest09RequireExplicitPolicy<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
                    ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar16);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_308.file._M_dataplus._M_p != &local_308.file.field_2) {
          operator_delete(local_308.file._M_dataplus._M_p,
                          local_308.file.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
          operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
        }
        if (local_1f8 != &local_1e8) {
          operator_delete(local_1f8,
                          CONCAT71(local_1e8._M_allocated_capacity._1_7_,local_1e8._M_local_buf[0])
                          + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_378._M_dataplus._M_p != &local_378.field_2) {
          operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
        }
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_328._M_dataplus._M_p != &local_328.field_2) {
          operator_delete(local_328._M_dataplus._M_p,
                          CONCAT17(local_328.field_2._M_local_buf[7],
                                   CONCAT61(local_328.field_2._M_allocated_capacity._1_6_,
                                            local_328.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_290._M_dataplus._M_p != &local_290.field_2) {
          operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
        }
        if (local_248 != &local_238) {
          operator_delete(local_248,
                          CONCAT17(local_238._M_local_buf[7],
                                   CONCAT61(local_238._M_allocated_capacity._1_6_,
                                            local_238._M_local_buf[0])) + 1);
        }
        uVar6 = local_350.field_2._M_allocated_capacity;
        paVar21 = &local_350.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p == paVar21) {
          local_390._8_8_ = local_350.field_2._8_8_;
          local_3a0 = &local_390;
        }
        else {
          local_3a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_350._M_dataplus._M_p;
        }
        local_390._M_allocated_capacity = local_350.field_2._M_allocated_capacity;
        local_398 = local_350._M_string_length;
        local_350._M_string_length = 0;
        local_350.field_2._M_allocated_capacity =
             local_350.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_380 = local_330;
        local_350._M_dataplus._M_p = (pointer)paVar21;
        if (local_3a0 != &local_390) {
          operator_delete(local_3a0,uVar6 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_allocated_capacity != &local_60) {
          operator_delete((void *)local_70._M_allocated_capacity,local_60._M_allocated_capacity + 1)
          ;
        }
        if (local_2e0 != &local_2d0) {
          operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
        }
        if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
          operator_delete((void *)local_90._0_8_,stack0xffffffffffffff80 + 1);
        }
        if (local_270 != &local_260) {
          operator_delete(local_270,
                          CONCAT17(local_260._M_local_buf[7],
                                   CONCAT61(local_260._M_allocated_capacity._1_6_,
                                            local_260._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        paVar21 = &local_170;
        if (local_180 != paVar21) {
          operator_delete(local_180,local_170._M_allocated_capacity + 1);
          paVar21 = extraout_RAX;
        }
        uVar9 = SUB81(paVar21,0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_138._M_dataplus._M_p != &local_138.field_2) {
          operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
          uVar9 = extraout_AL;
        }
        return (bool)uVar9;
      }
      goto LAB_002fd027;
    }
  }
  FormatFileLocation_abi_cxx11_
            (&local_308.file,(internal *)local_270->_M_local_buf,(char *)(ulong)local_250,iVar10);
  TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
  ::Register();
LAB_002fd027:
  FormatFileLocation_abi_cxx11_
            (&local_308.file,(internal *)local_2e0->_M_local_buf,(char *)(ulong)local_2c0,iVar10);
  TypeParameterizedTestSuite<bssl::PkitsTest09RequireExplicitPolicy,testing::internal::Templates<bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidRequireExplicitPolicyTest5,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9ValidSelfIssuedrequireExplicitPolicyTest6,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest7,bssl::gtest_suite_PkitsTest09RequireExplicitPolicy_::Section9InvalidSelfIssuedrequireExplicitPolicyTest8>,testing::internal::Types<bssl::(anonymous_namespace)::PathBuilderPkitsTestDelegate>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_378._M_dataplus._M_p != &local_378.field_2) {
    operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
  }
  if (local_3a0 != &local_390) {
    operator_delete(local_3a0,local_390._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT17(local_328.field_2._M_local_buf[7],
                             CONCAT61(local_328.field_2._M_allocated_capacity._1_6_,
                                      local_328.field_2._M_local_buf[0])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if (local_248 != &local_238) {
    operator_delete(local_248,
                    CONCAT17(local_238._M_local_buf[7],
                             CONCAT61(local_238._M_allocated_capacity._1_6_,
                                      local_238._M_local_buf[0])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_350._M_dataplus._M_p != &local_350.field_2) {
    operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,local_b8->_M_allocated_capacity + 1);
  }
  if (local_2e0 != &local_2d0) {
    operator_delete(local_2e0,local_2d0._M_allocated_capacity + 1);
  }
  if ((CodeLocation *)local_90._0_8_ != (CodeLocation *)(local_90 + 0x10)) {
    operator_delete((void *)local_90._0_8_,(ulong)((local_1d8->file)._M_dataplus._M_p + 1));
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,
                    CONCAT17(local_260._M_local_buf[7],
                             CONCAT61(local_260._M_allocated_capacity._1_6_,
                                      local_260._M_local_buf[0])) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if (local_180 != &local_170) {
    operator_delete(local_180,local_170._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }